

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportconsole.cpp
# Opt level: O0

void __thiscall
trun::ResultsReportConsole::PrintFailures
          (ResultsReportConsole *this,
          vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
          *results)

{
  FILE *pFVar1;
  bool bVar2;
  undefined4 uVar3;
  bool bVar4;
  kTestResult kVar5;
  kTestResult kVar6;
  kTestResult kVar7;
  kFailState kVar8;
  uint uVar9;
  reference psVar10;
  element_type *peVar11;
  string *psVar12;
  char *pcVar13;
  AssertError *pAVar14;
  size_t sVar15;
  vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  *this_00;
  reference pAVar16;
  char *pcVar17;
  string local_e0;
  undefined1 local_c0 [8];
  AssertErrorItem aerr;
  const_iterator __end4;
  const_iterator __begin4;
  vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  *__range4;
  int nChars;
  undefined1 local_48 [8];
  shared_ptr<trun::TestResult> r;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
  *__range1;
  bool haveHeader;
  vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
  *results_local;
  ResultsReportConsole *this_local;
  
  bVar2 = false;
  __end1 = std::
           vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
           ::begin(results);
  r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
       ::end(results);
  while (bVar4 = __gnu_cxx::
                 operator==<const_std::shared_ptr<trun::TestResult>_*,_std::vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>_>
                           (&__end1,(__normal_iterator<const_std::shared_ptr<trun::TestResult>_*,_std::vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>_>
                                     *)&r.
                                        super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount), ((bVar4 ^ 0xffU) & 1) != 0) {
    psVar10 = __gnu_cxx::
              __normal_iterator<const_std::shared_ptr<trun::TestResult>_*,_std::vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>_>
              ::operator*(&__end1);
    std::shared_ptr<trun::TestResult>::shared_ptr((shared_ptr<trun::TestResult> *)local_48,psVar10);
    peVar11 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_48);
    kVar5 = TestResult::Result(peVar11);
    if (kVar5 != kTestResult_Pass) {
      if (!bVar2) {
        fprintf((FILE *)(this->super_ResultsReportPinterBase).fout,"Failed:\n");
        bVar2 = true;
      }
      peVar11 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_48);
      kVar5 = TestResult::Result(peVar11);
      peVar11 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_48);
      kVar6 = TestResult::Result(peVar11);
      peVar11 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_48);
      kVar7 = TestResult::Result(peVar11);
      peVar11 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_48);
      psVar12 = TestResult::SymbolName_abi_cxx11_(peVar11);
      pcVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                c_str(psVar12);
      uVar9 = snprintf(PrintFailures::lineHeader,0x40,"  [%c%c%c]: %s",
                       (ulong)((uint)(kVar5 != kTestResult_TestFail) << 5 | 0x54),
                       (ulong)((uint)(kVar6 != kTestResult_ModuleFail) << 5 | 0x4d),
                       (ulong)((uint)(kVar7 != kTestResult_AllFail) << 5 | 0x41),pcVar13);
      if (-1 < (int)uVar9) {
        if (uVar9 < 0x40) {
          peVar11 = std::
                    __shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_48);
          kVar8 = TestResult::FailState(peVar11);
          if (kVar8 != Main) {
            peVar11 = std::
                      __shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_48);
            psVar12 = TestResult::FailStateName_abi_cxx11_(peVar11);
            pcVar13 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                                (psVar12);
            snprintf(PrintFailures::lineHeader + (int)uVar9,0x40 - (long)(int)uVar9," (%s)",pcVar13)
            ;
          }
        }
        peVar11 = std::
                  __shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_48);
        pAVar14 = TestResult::AssertError(peVar11);
        sVar15 = AssertError::NumErrors(pAVar14);
        if (sVar15 == 0) {
          pFVar1 = (FILE *)(this->super_ResultsReportPinterBase).fout;
          peVar11 = std::
                    __shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_48);
          TestResult::ErrorString_abi_cxx11_(&local_e0,peVar11);
          pcVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::c_str(&local_e0);
          fprintf(pFVar1,"%s, %s\n",PrintFailures::lineHeader,pcVar13);
          std::__cxx11::string::~string((string *)&local_e0);
        }
        else {
          peVar11 = std::
                    __shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_48);
          pAVar14 = TestResult::AssertError(peVar11);
          this_00 = AssertError::Errors(pAVar14);
          __end4 = std::
                   vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
                   ::begin(this_00);
          aerr.message.field_2._8_8_ =
               std::
               vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
               ::end(this_00);
          while (bVar4 = __gnu_cxx::
                         operator==<const_trun::AssertError::AssertErrorItem_*,_std::vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>_>
                                   (&__end4,(__normal_iterator<const_trun::AssertError::AssertErrorItem_*,_std::vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>_>
                                             *)((long)&aerr.message.field_2 + 8)),
                ((bVar4 ^ 0xffU) & 1) != 0) {
            pAVar16 = __gnu_cxx::
                      __normal_iterator<const_trun::AssertError::AssertErrorItem_*,_std::vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>_>
                      ::operator*(&__end4);
            AssertError::AssertErrorItem::AssertErrorItem((AssertErrorItem *)local_c0,pAVar16);
            pFVar1 = (FILE *)(this->super_ResultsReportPinterBase).fout;
            pcVar13 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&aerr);
            uVar3 = local_c0._4_4_;
            pcVar17 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&aerr.file.field_2 + 8));
            fprintf(pFVar1,"%s, %s:%d, %s\n",PrintFailures::lineHeader,pcVar13,(ulong)(uint)uVar3,
                    pcVar17);
            AssertError::AssertErrorItem::~AssertErrorItem((AssertErrorItem *)local_c0);
            __gnu_cxx::
            __normal_iterator<const_trun::AssertError::AssertErrorItem_*,_std::vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>_>
            ::operator++(&__end4);
          }
        }
      }
    }
    std::shared_ptr<trun::TestResult>::~shared_ptr((shared_ptr<trun::TestResult> *)local_48);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<trun::TestResult>_*,_std::vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void ResultsReportConsole::PrintFailures(const std::vector<TestResult::Ref> &results) {
    bool haveHeader = false;
    static char lineHeader[64];
    for(auto r : results) {
        if (r->Result() != kTestResult_Pass) {
            // Only print this the first time if we have any...
            if (!haveHeader) {
                fprintf(fout, "Failed:\n");
                haveHeader = true;
            }
            auto nChars = snprintf(lineHeader, sizeof(lineHeader),"  [%c%c%c]: %s",
                     r->Result() == kTestResult_TestFail?'T':'t',
                     r->Result() == kTestResult_ModuleFail?'M':'m',
                     r->Result() == kTestResult_AllFail?'A':'a',
                     r->SymbolName().c_str());

            if (nChars < 0) {
                continue;
            }
            // Append if there is room left...
            if ((nChars < sizeof(lineHeader)) && (r->FailState() != TestResult::kFailState::Main)) {
                //fprintf(fout, " (%s)", r->FailStateName().c_str());
                snprintf(&lineHeader[nChars], sizeof(lineHeader) - nChars, " (%s)", r->FailStateName().c_str());
            }

            if (r->AssertError().NumErrors() > 0) {
                for(auto aerr : r->AssertError().Errors()) {
                    fprintf(fout, "%s, %s:%d, %s\n", lineHeader,
                            aerr.file.c_str(),
                            aerr.line,
                            aerr.message.c_str());
                }
            } else {
                fprintf(fout, "%s, %s\n", lineHeader, r->ErrorString().c_str());
            }
        }
    }
}